

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBCellFlag.cpp
# Opt level: O1

NumCells *
amrex::anon_unknown_27::countCells
          (NumCells *__return_storage_ptr__,Array4<const_amrex::EBCellFlag> *flag,Box *bx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  FabType FVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  
  iVar10 = (bx->bigend).vect[0];
  iVar1 = (bx->smallend).vect[0];
  iVar2 = (bx->smallend).vect[1];
  iVar8 = (iVar10 - iVar1) + 1;
  iVar3 = (bx->bigend).vect[1];
  iVar4 = (bx->bigend).vect[2];
  iVar5 = (bx->smallend).vect[2];
  iVar9 = ((iVar4 - iVar5) + 1) * ((iVar3 - iVar2) + 1) * iVar8;
  iVar14 = 0;
  iVar15 = 0;
  iVar16 = 0;
  if (iVar5 <= iVar4) {
    iVar15 = 0;
    iVar16 = 0;
    do {
      if (iVar2 <= iVar3) {
        lVar7 = ((long)iVar5 - (long)(flag->begin).z) * flag->kstride;
        iVar6 = iVar2;
        do {
          if (iVar1 <= iVar10) {
            lVar11 = ((long)iVar6 - (long)(flag->begin).y) * flag->jstride;
            uVar18 = (ulong)(iVar1 - (flag->begin).x);
            iVar12 = iVar8;
            switch(flag->p[lVar7 + lVar11 + uVar18].flag & 3) {
            case 1:
              goto switchD_0051e299_caseD_1;
            case 2:
              goto switchD_0051e299_caseD_2;
            case 3:
              goto switchD_0051e299_caseD_3;
            }
switchD_0051e299_caseD_0:
            iVar14 = iVar14 + 1;
            goto switchD_0051e299_caseD_3;
          }
LAB_0051e266:
          bVar19 = iVar6 != iVar3;
          iVar6 = iVar6 + 1;
        } while (bVar19);
      }
      bVar19 = iVar5 != iVar4;
      iVar5 = iVar5 + 1;
    } while (bVar19);
  }
  iVar10 = iVar15 + iVar14 + iVar16;
  __return_storage_ptr__->nregular = 0;
  __return_storage_ptr__->nsingle = 0;
  __return_storage_ptr__->nmulti = 0;
  __return_storage_ptr__->ncovered = 0;
  __return_storage_ptr__->type = undefined;
  FVar13 = regular;
  if (iVar14 != iVar9) {
    if (iVar10 == 0) {
      FVar13 = covered;
    }
    else {
      FVar13 = (uint)(0 < iVar16) + singlevalued;
    }
  }
  __return_storage_ptr__->type = FVar13;
  __return_storage_ptr__->nregular = iVar14;
  __return_storage_ptr__->nsingle = iVar15;
  __return_storage_ptr__->nmulti = iVar16;
  __return_storage_ptr__->ncovered = iVar9 - iVar10;
  return __return_storage_ptr__;
  do {
    uVar17 = (int)uVar18 + 1;
    uVar18 = (ulong)uVar17;
    switch(flag->p[lVar7 + lVar11 + (int)uVar17].flag & 3) {
    case 0:
      goto switchD_0051e299_caseD_0;
    case 1:
switchD_0051e299_caseD_1:
      iVar15 = iVar15 + 1;
    case 3:
switchD_0051e299_caseD_3:
      iVar12 = iVar12 + -1;
      if (iVar12 == 0) goto LAB_0051e266;
      break;
    case 2:
switchD_0051e299_caseD_2:
      iVar16 = iVar16 + 1;
      break;
    }
  } while( true );
}

Assistant:

EBCellFlagFab::NumCells countCells (Array4<EBCellFlag const> const& flag, const Box& bx) noexcept
{
    int nregular=0, nsingle=0, nmulti=0;
    int ncells = static_cast<int>(bx.numPts());
    AMREX_ASSERT(bx.numPts() <= static_cast<Long>(std::numeric_limits<int>::max()));

    if (Gpu::inLaunchRegion())
    {
        ReduceOps<ReduceOpSum,ReduceOpSum,ReduceOpSum> reduce_op;
        ReduceData<int,int,int> reduce_data(reduce_op);
        using ReduceTuple = typename decltype(reduce_data)::Type;
        reduce_op.eval(bx, reduce_data,
        [=] AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
        {
            int nr=0, ns=0, nm=0;
            auto f = flag(i,j,k);
            if (f.isRegular()) {
                ++nr;
            } else if (f.isSingleValued()) {
                ++ns;
            } else if (f.isMultiValued()) {
                ++nm;
            }
            return {nr, ns, nm};
        });
        ReduceTuple hv = reduce_data.value(reduce_op);
        nregular = amrex::get<0>(hv);
        nsingle  = amrex::get<1>(hv);
        nmulti   = amrex::get<2>(hv);
    }
    else
    {
        amrex::LoopOnCpu(bx,
        [=,&nregular,&nsingle,&nmulti] (int i, int j, int k) noexcept
        {
            auto f = flag(i,j,k);
            if (f.isRegular()) {
                ++nregular;
            } else if (f.isSingleValued()) {
                ++nsingle;
            } else if (f.isMultiValued()) {
                ++nmulti;
            }
        });
    }

    int ncovered = ncells - nregular - nsingle - nmulti;

    EBCellFlagFab::NumCells r;
    if (nregular == ncells) {
        r.type = FabType::regular;
    } else if (ncovered == ncells) {
        r.type = FabType::covered;
    } else if (nmulti > 0) {
        r.type = FabType::multivalued;
    } else {
        r.type = FabType::singlevalued;
    }
    r.nregular = nregular;
    r.nsingle = nsingle;
    r.nmulti = nmulti;
    r.ncovered = ncovered;
    return r;
}